

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.h
# Opt level: O0

void __thiscall Assimp::IFC::ConversionData::~ConversionData(ConversionData *this)

{
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  ConversionData *this_local;
  
  iVar1 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(&this->meshes);
  iVar2 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(&this->meshes);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,Assimp::IFC::delete_fun<aiMesh>>
            (iVar1._M_current,iVar2._M_current);
  iVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin(&this->materials);
  iVar4 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end(&this->materials);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,Assimp::IFC::delete_fun<aiMaterial>>
            (iVar3._M_current,iVar4._M_current);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            (&this->already_processed);
  std::
  map<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*,_unsigned_int,_std::less<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*>,_std::allocator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>_>
  ::~map(&this->cached_materials);
  std::
  map<Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<Assimp::IFC::ConversionData::MeshCacheIndex>,_std::allocator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::~map(&this->cached_meshes);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~vector(&this->materials);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector(&this->meshes);
  return;
}

Assistant:

~ConversionData() {
        std::for_each(meshes.begin(),meshes.end(),delete_fun<aiMesh>());
        std::for_each(materials.begin(),materials.end(),delete_fun<aiMaterial>());
    }